

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QControlledGate2<std::complex<float>_>::setQubits
          (QControlledGate2<std::complex<float>_> *this,int *qubits)

{
  int *qubits_local;
  QControlledGate2<std::complex<float>_> *this_local;
  
  if (*qubits < 0) {
    __assert_fail("qubits[0] >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/QControlledGate2.hpp"
                  ,0x39,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::setQubits(const int *) [T = std::complex<float>]"
                 );
  }
  if (-1 < qubits[1]) {
    if (*qubits != qubits[1]) {
      this->control_ = *qubits;
      (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject
        [0x11])(this,(ulong)(uint)qubits[1]);
      return;
    }
    __assert_fail("qubits[0] != qubits[1]",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/QControlledGate2.hpp"
                  ,0x3a,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::setQubits(const int *) [T = std::complex<float>]"
                 );
  }
  __assert_fail("qubits[1] >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/QControlledGate2.hpp"
                ,0x39,
                "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::setQubits(const int *) [T = std::complex<float>]"
               );
}

Assistant:

inline void setQubits( const int* qubits ) override {
          assert( qubits[0] >= 0 ) ; assert( qubits[1] >= 0 ) ;
          assert( qubits[0] != qubits[1] ) ;
          control_ = qubits[0] ;
          this->setTarget( qubits[1] ) ;
        }